

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLCryptoFactory.cpp
# Opt level: O2

AsymmetricAlgorithm * __thiscall
OSSLCryptoFactory::getAsymmetricAlgorithm(OSSLCryptoFactory *this,Type algorithm)

{
  OSSLRSA *this_00;
  
  switch(algorithm) {
  case RSA:
    this_00 = (OSSLRSA *)operator_new(0x40);
    OSSLRSA::OSSLRSA(this_00);
    break;
  case DSA:
    this_00 = (OSSLRSA *)operator_new(0x30);
    OSSLDSA::OSSLDSA((OSSLDSA *)this_00);
    break;
  case DH:
    this_00 = (OSSLRSA *)operator_new(0x28);
    (this_00->super_AsymmetricAlgorithm)._vptr_AsymmetricAlgorithm = (_func_int **)0x0;
    (this_00->super_AsymmetricAlgorithm).currentPublicKey = (PublicKey *)0x0;
    (this_00->super_AsymmetricAlgorithm).currentPrivateKey = (PrivateKey *)0x0;
    (this_00->super_AsymmetricAlgorithm).currentMechanism = Unknown;
    (this_00->super_AsymmetricAlgorithm).currentPadding = Unknown;
    *(undefined8 *)&(this_00->super_AsymmetricAlgorithm).currentOperation = 0;
    OSSLDH::OSSLDH((OSSLDH *)this_00);
    break;
  case ECDH:
    this_00 = (OSSLRSA *)operator_new(0x28);
    (this_00->super_AsymmetricAlgorithm)._vptr_AsymmetricAlgorithm = (_func_int **)0x0;
    (this_00->super_AsymmetricAlgorithm).currentPublicKey = (PublicKey *)0x0;
    (this_00->super_AsymmetricAlgorithm).currentPrivateKey = (PrivateKey *)0x0;
    (this_00->super_AsymmetricAlgorithm).currentMechanism = Unknown;
    (this_00->super_AsymmetricAlgorithm).currentPadding = Unknown;
    *(undefined8 *)&(this_00->super_AsymmetricAlgorithm).currentOperation = 0;
    OSSLECDH::OSSLECDH((OSSLECDH *)this_00);
    break;
  case ECDSA:
    this_00 = (OSSLRSA *)operator_new(0x28);
    (this_00->super_AsymmetricAlgorithm)._vptr_AsymmetricAlgorithm = (_func_int **)0x0;
    (this_00->super_AsymmetricAlgorithm).currentPublicKey = (PublicKey *)0x0;
    (this_00->super_AsymmetricAlgorithm).currentPrivateKey = (PrivateKey *)0x0;
    (this_00->super_AsymmetricAlgorithm).currentMechanism = Unknown;
    (this_00->super_AsymmetricAlgorithm).currentPadding = Unknown;
    *(undefined8 *)&(this_00->super_AsymmetricAlgorithm).currentOperation = 0;
    OSSLECDSA::OSSLECDSA((OSSLECDSA *)this_00);
    break;
  default:
    this_00 = (OSSLRSA *)0x0;
    softHSMLog(3,"getAsymmetricAlgorithm",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLCryptoFactory.cpp"
               ,0x164,"Unknown algorithm \'%i\'");
    break;
  case EDDSA:
    this_00 = (OSSLRSA *)operator_new(0x28);
    (this_00->super_AsymmetricAlgorithm)._vptr_AsymmetricAlgorithm = (_func_int **)0x0;
    (this_00->super_AsymmetricAlgorithm).currentPublicKey = (PublicKey *)0x0;
    (this_00->super_AsymmetricAlgorithm).currentPrivateKey = (PrivateKey *)0x0;
    (this_00->super_AsymmetricAlgorithm).currentMechanism = Unknown;
    (this_00->super_AsymmetricAlgorithm).currentPadding = Unknown;
    *(undefined8 *)&(this_00->super_AsymmetricAlgorithm).currentOperation = 0;
    OSSLEDDSA::OSSLEDDSA((OSSLEDDSA *)this_00);
  }
  return &this_00->super_AsymmetricAlgorithm;
}

Assistant:

AsymmetricAlgorithm* OSSLCryptoFactory::getAsymmetricAlgorithm(AsymAlgo::Type algorithm)
{
	switch (algorithm)
	{
		case AsymAlgo::RSA:
			return new OSSLRSA();
		case AsymAlgo::DSA:
			return new OSSLDSA();
		case AsymAlgo::DH:
			return new OSSLDH();
#ifdef WITH_ECC
		case AsymAlgo::ECDH:
			return new OSSLECDH();
		case AsymAlgo::ECDSA:
			return new OSSLECDSA();
#endif
#ifdef WITH_GOST
		case AsymAlgo::GOST:
			return new OSSLGOST();
#endif
#ifdef WITH_EDDSA
		case AsymAlgo::EDDSA:
			return new OSSLEDDSA();
#endif
		default:
			break;
	}

	// No algorithm implementation is available
	ERROR_MSG("Unknown algorithm '%i'", algorithm);
	return NULL;
}